

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

int map_insert_array(map m,map_key *keys,map_value *values,size_t size)

{
  int iVar1;
  size_t sVar2;
  char *message;
  
  if (values == (map_value *)0x0 || (keys == (map_key *)0x0 || m == (map)0x0)) {
    message = "Invalid map insertion parameters";
    sVar2 = 0xde;
LAB_00117316:
    log_write_impl_va("metacall",sVar2,"map_insert_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,LOG_LEVEL_ERROR,message);
    iVar1 = 1;
  }
  else {
    if (size != 0) {
      sVar2 = 0;
      do {
        iVar1 = map_insert(m,keys[sVar2],values[sVar2]);
        if (iVar1 != 0) {
          message = "Invalid map array insertion";
          sVar2 = 0xe6;
          goto LAB_00117316;
        }
        sVar2 = sVar2 + 1;
      } while (size != sVar2);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int map_insert_array(map m, map_key keys[], map_value values[], size_t size)
{
	size_t iterator;

	if (m == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (map_insert(m, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map array insertion");
			return 1;
		}
	}

	return 0;
}